

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O3

void __thiscall Centaurus::NFA<char>::NFA(NFA<char> *this,Stream *stream)

{
  CharClass<char> local_48;
  
  (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
  super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
  super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
  super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>)._vptr_NFABase =
       (_func_int **)&PTR__NFABase_0019d200;
  std::
  vector<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>::
  _M_realloc_insert<>(&(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states,
                      (iterator)0x0);
  local_48._vptr_CharClass = (_func_int **)&PTR__CharClass_0019d090;
  local_48.m_ranges.
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_ranges.
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_ranges.
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  add_state(this,&local_48);
  local_48._vptr_CharClass = (_func_int **)&PTR__CharClass_0019d090;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
            (&local_48.m_ranges);
  parse(this,stream);
  return;
}

Assistant:

NFA(Stream& stream)
    {
        m_states.emplace_back();
        add_state(CharClass<TCHAR>());
        
        parse(stream);
    }